

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O1

bool operator>(BigNumber *value1,BigNumber *value2)

{
  pointer puVar1;
  pointer puVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  
  BigNumber::m_format(value1);
  BigNumber::m_format(value2);
  puVar1 = (value1->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(value1->super_Polynome).m_coef.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2;
  puVar2 = (value2->super_Polynome).m_coef.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = 1;
  bVar3 = 1;
  uVar5 = (uint)uVar6;
  uVar7 = (uint)((ulong)((long)(value2->super_Polynome).m_coef.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) >> 2);
  if (uVar5 <= uVar7) {
    if (uVar5 == uVar7) {
      uVar6 = uVar6 & 0xffffffff;
      do {
        bVar3 = (byte)uVar4;
        iVar8 = (int)uVar6;
        if (iVar8 < 1) goto LAB_001026fa;
        uVar4 = puVar1[uVar6 + 0xffffffffffffffff];
        uVar5 = puVar2[uVar6 + 0xffffffffffffffff];
        if (uVar5 < uVar4) {
          bVar3 = 1;
          goto LAB_001026fa;
        }
        uVar6 = uVar6 - 1;
      } while (uVar4 == uVar5);
      bVar3 = 0;
LAB_001026fa:
      if (0 < iVar8) goto LAB_00102700;
    }
    bVar3 = 0;
  }
LAB_00102700:
  return (bool)(bVar3 & 1);
}

Assistant:

bool operator > (BigNumber& value1, BigNumber& value2){
    value1.m_format();
    value2.m_format();
    if(value1.m_degre() > value2.m_degre()){
        return true;
    }

    else if(value1.m_degre() == value2.m_degre()){
        for(int i = (int) value1.m_degre() - 1; i >= 0; i--){
            if(value1.m_coef[i] > value2.m_coef[i]){
                return true;
            }
            else if(value1.m_coef[i] != value2.m_coef[i]){
                return false;
            }
        }
    }
    return false;

}